

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert2Pow2(EExpr *__return_storage_ptr__,
              ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *this,LinTerms *ellt,LinTerms *erlt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  VarOrConst VVar4;
  NodeRange NVar5;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  local_58;
  
  dVar2 = *(ellt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  dVar3 = *(erlt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  local_58.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>.args_
  ._M_elems[0] = (_Type)*(ellt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  paVar1 = &local_58.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_58.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_58.super_FunctionalConstraint.result_var_ = -1;
  local_58.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_58.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>.
  params_._M_elems[0] = (_Type)2.0;
  local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1
  ;
  VVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)&this->flat_cvt_,&local_58);
  value = VVar4.field_1;
  if (((undefined1  [16])VVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    NVar5 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(&(this->flat_cvt_).
                            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ,value.c_);
    value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar5.ir_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar1)
  {
    operator_delete(local_58.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,CONCAT71(local_58.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_allocated_capacity._1_7_,
                              local_58.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_local_buf[0]) + 1);
  }
  EExpr::EExpr(__return_storage_ptr__,dVar2 * dVar3,value.var_);
  return __return_storage_ptr__;
}

Assistant:

EExpr Convert2Pow2(const LinTerms& ellt, const LinTerms& erlt) {
    assert(1 == erlt.size() &&    // same variable in el and er
           ellt.var(0) == erlt.var(0));
    auto coef = ellt.coef(0) * erlt.coef(0);
    auto pow2var = GetFlatCvt().AssignResultVar2Args(
          PowConstExpConstraint{ {{ellt.var(0)}}, {2.0} });
    return { coef, pow2var };
  }